

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

object __thiscall
pybind11::detail::object_api<pybind11::handle>::operator()
          (object_api<pybind11::handle> *this,cpp_function *args)

{
  int iVar1;
  handle *this_00;
  PyTypeObject *in_RDX;
  PyObject local_28;
  cpp_function *args_local;
  object_api<pybind11::handle> *this_local;
  
  local_28.ob_type = in_RDX;
  args_local = args;
  this_local = this;
  iVar1 = PyGILState_Check();
  if (iVar1 == 0) {
    pybind11_fail("pybind11::object_api<>::operator() PyGILState_Check() failure.");
  }
  collect_arguments<(pybind11::return_value_policy)1,pybind11::cpp_function,void>
            ((detail *)&local_28,(cpp_function *)local_28.ob_type);
  this_00 = derived((object_api<pybind11::handle> *)args);
  pybind11::handle::ptr(this_00);
  simple_collector<(pybind11::return_value_policy)1>::call
            ((simple_collector<(pybind11::return_value_policy)1> *)this,&local_28);
  simple_collector<(pybind11::return_value_policy)1>::~simple_collector
            ((simple_collector<(pybind11::return_value_policy)1> *)&local_28);
  return (object)(handle)this;
}

Assistant:

object object_api<Derived>::operator()(Args &&...args) const {
#if !defined(NDEBUG) && PY_VERSION_HEX >= 0x03060000
    if (!PyGILState_Check()) {
        pybind11_fail("pybind11::object_api<>::operator() PyGILState_Check() failure.");
    }
#endif
    return detail::collect_arguments<policy>(std::forward<Args>(args)...).call(derived().ptr());
}